

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_box.cpp
# Opt level: O2

void Omega_h::make_3d_box(Real x,Real y,Real z,LO nx,LO ny,LO nz,LOs *hv2v_out,Reals *coords_out)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Write<int> hv2v;
  Write<double> coords;
  type fill_conn;
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  double dStack_158;
  double local_150;
  Real local_148;
  int local_13c;
  ulong local_138;
  Write<int> local_130;
  Write<double> local_120;
  Write<double> *local_110;
  Write<int> *local_108;
  ulong local_100;
  Write<double> local_f8;
  Write<int> local_e8;
  pointer local_d8;
  Write<double> local_d0;
  double local_c0;
  double dStack_b8;
  double local_b0;
  int local_a8;
  LO LStack_a4;
  Write<int> local_a0;
  undefined4 local_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  Write<double> local_80;
  undefined1 local_70 [16];
  double local_60;
  Real local_58;
  Real local_48;
  
  local_148 = z;
  local_58 = y;
  local_48 = x;
  std::__cxx11::string::string((string *)local_178,"",(allocator *)&local_d8);
  iVar4 = nx + 1;
  iVar11 = (ny + 1) * iVar4;
  uVar6 = (nz + 1) * iVar11;
  local_138 = (ulong)(uint)ny;
  local_110 = &coords_out->write_;
  local_108 = &hv2v_out->write_;
  local_100 = (ulong)(uint)nz;
  Write<double>::Write(&local_120,uVar6 * 3,(string *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  local_13c = iVar4;
  local_88 = iVar11;
  iStack_84 = iVar4;
  Write<double>::Write(&local_80,&local_120);
  auVar12._0_8_ = (double)nx;
  auVar12._8_8_ = (double)(int)local_138;
  auVar13._8_8_ = local_58;
  auVar13._0_8_ = local_48;
  local_70 = divpd(auVar13,auVar12);
  iVar4 = (int)local_100;
  local_60 = local_148 / (double)iVar4;
  local_d8 = (pointer)CONCAT44(iStack_84,local_88);
  Write<double>::Write(&local_d0,&local_80);
  local_b0 = local_60;
  local_c0 = (double)local_70._0_8_;
  dStack_b8 = (double)local_70._8_8_;
  local_148 = (Real)CONCAT44(local_148._4_4_,iVar11);
  if (0 < (int)uVar6) {
    entering_parallel = 1;
    local_178._0_8_ = local_d8;
    Write<double>::Write((Write<signed_char> *)(local_178 + 8),(Write<signed_char> *)&local_d0);
    local_150 = local_b0;
    local_168._8_8_ = local_c0;
    dStack_158 = dStack_b8;
    entering_parallel = 0;
    pdVar10 = (double *)(local_168._M_allocated_capacity + 0x10);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      uVar2 = (long)uVar1 % (long)(int)local_178._0_4_;
      uVar2 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
      pdVar10[-2] = (double)(int)((long)uVar2 % (long)(int)local_178._4_4_) * local_c0;
      pdVar10[-1] = (double)(int)((long)uVar2 / (long)(int)local_178._4_4_) * dStack_b8;
      *pdVar10 = (double)(int)((long)uVar1 / (long)(int)local_178._0_4_) * local_b0;
      pdVar10 = pdVar10 + 3;
    }
    Write<double>::~Write((Write<double> *)(local_178 + 8));
  }
  Write<double>::~Write(&local_d0);
  std::__cxx11::string::string((string *)local_178,"",(allocator *)&local_d8);
  iVar11 = (int)local_138 * nx;
  uVar6 = iVar4 * iVar11;
  Write<int>::Write(&local_130,uVar6 * 8,(string *)local_178);
  iVar4 = local_13c;
  std::__cxx11::string::~string((string *)local_178);
  local_a8 = iVar11;
  LStack_a4 = nx;
  Write<int>::Write(&local_a0,&local_130);
  local_90 = local_148._0_4_;
  iStack_8c = iVar4;
  local_d8 = (pointer)CONCAT44(LStack_a4,local_a8);
  Write<int>::Write((Write<int> *)&local_d0,&local_a0);
  local_c0 = (double)CONCAT44(iStack_8c,local_90);
  if (0 < (int)uVar6) {
    entering_parallel = 1;
    local_178._0_8_ = local_d8;
    Write<int>::Write((Write<int> *)(local_178 + 8),(Write<int> *)&local_d0);
    local_168._8_8_ = local_c0;
    uVar3 = local_168._8_8_;
    entering_parallel = 0;
    piVar8 = (int *)(local_168._M_allocated_capacity + 0x1c);
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      uVar2 = (long)uVar1 % (long)(int)local_178._0_4_;
      uVar2 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
      local_168._8_4_ = SUB84(local_c0,0);
      iVar7 = (int)((long)uVar1 / (long)(int)local_178._0_4_);
      local_168._12_4_ = (undefined4)((ulong)local_c0 >> 0x20);
      iVar4 = (int)((long)uVar2 / (long)(int)local_178._4_4_);
      iVar11 = (int)((long)uVar2 % (long)(int)local_178._4_4_);
      piVar8[-7] = local_168._8_4_ * iVar7 + iVar11 + local_168._12_4_ * iVar4;
      piVar8[-6] = local_168._8_4_ * iVar7 + iVar11 + 1 + local_168._12_4_ * iVar4;
      iVar9 = iVar4 + 1;
      piVar8[-5] = local_168._8_4_ * iVar7 + iVar11 + 1 + local_168._12_4_ * iVar9;
      piVar8[-4] = local_168._8_4_ * iVar7 + iVar11 + local_168._12_4_ * iVar9;
      iVar7 = iVar7 + 1;
      piVar8[-3] = local_168._8_4_ * iVar7 + iVar11 + local_168._12_4_ * iVar4;
      piVar8[-2] = local_168._8_4_ * iVar7 + iVar11 + 1 + iVar4 * local_168._12_4_;
      piVar8[-1] = local_168._8_4_ * iVar7 + iVar11 + 1 + local_168._12_4_ * iVar9;
      *piVar8 = iVar7 * local_168._8_4_ + iVar11 + iVar9 * local_168._12_4_;
      piVar8 = piVar8 + 8;
    }
    local_168._8_8_ = uVar3;
    Write<int>::~Write((Write<int> *)(local_178 + 8));
  }
  Write<int>::~Write((Write<int> *)&local_d0);
  Write<int>::Write(&local_e8,&local_130);
  Read<int>::Read((Read<signed_char> *)local_178,&local_e8);
  Write<int>::operator=(local_108,(Write<int> *)local_178);
  Write<int>::~Write((Write<int> *)local_178);
  Write<int>::~Write(&local_e8);
  Write<double>::Write(&local_f8,&local_120);
  Read<double>::Read((Read<signed_char> *)local_178,&local_f8);
  Write<double>::operator=(local_110,(Write<signed_char> *)local_178);
  Write<double>::~Write((Write<double> *)local_178);
  Write<double>::~Write(&local_f8);
  Write<int>::~Write(&local_a0);
  Write<int>::~Write(&local_130);
  Write<double>::~Write(&local_80);
  Write<double>::~Write(&local_120);
  return;
}

Assistant:

void make_3d_box(Real x, Real y, Real z, LO nx, LO ny, LO nz, LOs* hv2v_out,
    Reals* coords_out) {
  LO nxy = nx * ny;
  LO nh = nx * ny * nz;
  LO nvx = nx + 1;
  LO nvy = ny + 1;
  LO nvz = nz + 1;
  LO nvxy = nvx * nvy;
  LO nv = nvx * nvy * nvz;
  Real dx = x / nx;
  Real dy = y / ny;
  Real dz = z / nz;
  Write<Real> coords(nv * 3);
  auto fill_coords = OMEGA_H_LAMBDA(LO v) {
    LO ij = v % nvxy;
    LO k = v / nvxy;
    LO i = ij % nvx;
    LO j = ij / nvx;
    coords[v * 3 + 0] = i * dx;
    coords[v * 3 + 1] = j * dy;
    coords[v * 3 + 2] = k * dz;
  };
  parallel_for(nv, fill_coords, "make_3d_box(coords)");
  Write<LO> hv2v(nh * 8);
  auto fill_conn = OMEGA_H_LAMBDA(LO h) {
    LO ij = h % nxy;
    LO k = h / nxy;
    LO i = ij % nx;
    LO j = ij / nx;
    hv2v[h * 8 + 0] = (k + 0) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 1] = (k + 0) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 2] = (k + 0) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 3] = (k + 0) * nvxy + (j + 1) * nvx + (i + 0);
    hv2v[h * 8 + 4] = (k + 1) * nvxy + (j + 0) * nvx + (i + 0);
    hv2v[h * 8 + 5] = (k + 1) * nvxy + (j + 0) * nvx + (i + 1);
    hv2v[h * 8 + 6] = (k + 1) * nvxy + (j + 1) * nvx + (i + 1);
    hv2v[h * 8 + 7] = (k + 1) * nvxy + (j + 1) * nvx + (i + 0);
  };
  parallel_for(nh, fill_conn, "make_3d_box(conn)");
  *hv2v_out = hv2v;
  *coords_out = coords;
}